

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# knote.c
# Opt level: O0

knote * knote_index_RB_FIND(knote_index *head,knote *elm)

{
  int iVar1;
  knote *in_RSI;
  undefined8 *in_RDI;
  int comp;
  knote *tmp;
  knote *local_20;
  
  local_20 = (knote *)*in_RDI;
  while( true ) {
    while( true ) {
      if (local_20 == (knote *)0x0) {
        return (knote *)0x0;
      }
      iVar1 = knote_cmp(in_RSI,local_20);
      if (-1 < iVar1) break;
      local_20 = (local_20->kn_index).rbe_left;
    }
    if (iVar1 < 1) break;
    local_20 = (local_20->kn_index).rbe_right;
  }
  return local_20;
}

Assistant:

struct knote *
knote_new(void)
{
    struct knote *res;

    res = calloc(1, sizeof(struct knote));
    if (res == NULL)
        return (NULL);

    res->kn_ref = 1;

    return (res);
}